

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
nitro::options::parser::parser(parser *this,string *app_name,string *about,string *group)

{
  undefined1 local_50 [27];
  allocator<char> local_35 [13];
  string *local_28;
  string *group_local;
  string *about_local;
  string *app_name_local;
  parser *this_local;
  
  local_28 = group;
  group_local = about;
  about_local = app_name;
  app_name_local = &this->app_name_;
  std::__cxx11::string::string((string *)this,(string *)app_name);
  std::__cxx11::string::string((string *)&this->about_,(string *)group_local);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::group>_>_>
  ::map(&this->groups_);
  std::vector<nitro::options::group_*,_std::allocator<nitro::options::group_*>_>::vector
            (&this->group_order_);
  this->allowed_positionals_ = 0;
  this->greedy_positionals_ = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->positional_name_,"args",local_35);
  std::allocator<char>::~allocator(local_35);
  std::forward_as_tuple<char_const(&)[10]>((char (*) [10])(local_50 + 0x10));
  std::forward_as_tuple<nitro::options::parser&,std::__cxx11::string_const&>
            ((parser *)local_50,&this->app_name_);
  std::
  map<std::__cxx11::string,nitro::options::group,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nitro::options::group>>>
  ::
  emplace<std::piecewise_construct_t_const&,std::tuple<char_const(&)[10]>,std::tuple<nitro::options::parser&,std::__cxx11::string_const&>>
            ((map<std::__cxx11::string,nitro::options::group,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nitro::options::group>>>
              *)&this->groups_,(piecewise_construct_t *)&std::piecewise_construct,
             (tuple<const_char_(&)[10]> *)(local_50 + 0x10),
             (tuple<nitro::options::parser_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)local_50);
  return;
}

Assistant:

parser::parser(const std::string& app_name, const std::string& about, const std::string& group)
    : app_name_(app_name), about_(about)
    {
        groups_.emplace(std::piecewise_construct, std::forward_as_tuple("__default"),
                        std::forward_as_tuple(*this, group));
    }